

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O2

void __thiscall duckdb::QueryResult::~QueryResult(QueryResult *this)

{
  (this->super_BaseQueryResult)._vptr_BaseQueryResult = (_func_int **)&PTR__QueryResult_027bd110;
  ::std::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>::~unique_ptr
            (&(this->next).
              super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>);
  ::std::__cxx11::string::~string((string *)&this->client_properties);
  BaseQueryResult::~BaseQueryResult(&this->super_BaseQueryResult);
  return;
}

Assistant:

QueryResult::~QueryResult() {
}